

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.hpp
# Opt level: O1

void __thiscall
jsoncons::basic_json_reader<char,_jsoncons::string_source<char>,_std::allocator<char>_>::check_done
          (basic_json_reader<char,_jsoncons::string_source<char>,_std::allocator<char>_> *this,
          error_code *ec)

{
  int iVar1;
  char_type *pcVar2;
  span<const_char,_18446744073709551615UL> sVar3;
  
  if ((this->source_).source_.current_ == (this->source_).source_.end_) {
    basic_json_parser<char,_std::allocator<char>_>::check_done(&this->parser_,ec);
    return;
  }
  do {
    if ((this->parser_).input_ptr_ == (this->parser_).end_input_) {
      sVar3 = json_source_adaptor<jsoncons::string_source<char>_>::read_buffer(&this->source_,ec);
      pcVar2 = sVar3.data_;
      iVar1 = ec->_M_value;
      if (sVar3.size_ != 0 && iVar1 == 0) {
        (this->parser_).begin_input_ = pcVar2;
        (this->parser_).end_input_ = pcVar2 + sVar3.size_;
        (this->parser_).input_ptr_ = pcVar2;
      }
      if (iVar1 != 0) {
        return;
      }
    }
    if (((this->parser_).input_ptr_ != (this->parser_).end_input_) &&
       (basic_json_parser<char,_std::allocator<char>_>::check_done(&this->parser_,ec),
       ec->_M_value != 0)) {
      return;
    }
  } while (((this->parser_).input_ptr_ != (this->parser_).end_input_) ||
          ((this->source_).source_.current_ != (this->source_).source_.end_));
  return;
}

Assistant:

void check_done(std::error_code& ec)
        {
            if (source_.is_error())
            {
                ec = json_errc::source_error;
                return;
            }   
            if (source_.eof())
            {
                parser_.check_done(ec);
                if (JSONCONS_UNLIKELY(ec)) return;
            }
            else
            {
                do
                {
                    if (parser_.source_exhausted())
                    {
                        auto s = source_.read_buffer(ec);
                        if (JSONCONS_UNLIKELY(ec)) return;
                        if (s.size() > 0)
                        {
                            parser_.update(s.data(),s.size());
                        }
                    }
                    if (!parser_.source_exhausted())
                    {
                        parser_.check_done(ec);
                        if (JSONCONS_UNLIKELY(ec)) return;
                    }
                }
                while (!eof());
            }
        }